

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifestuff.cpp
# Opt level: O3

int AF_A_ItBurnsItBurns(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  player_t *ppVar3;
  PClass *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  FState *state;
  APlayerPawn *ent;
  char *__assertion;
  bool bVar7;
  FName local_30;
  FSoundID local_2c;
  
  pPVar4 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005fec47;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (APlayerPawn *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent == (APlayerPawn *)0x0) {
LAB_005feacb:
        ent = (APlayerPawn *)0x0;
      }
      else {
        pPVar6 = (ent->super_AActor).super_DThinker.super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar5 = (**(ent->super_AActor).super_DThinker.super_DObject._vptr_DObject)(ent);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
          (ent->super_AActor).super_DThinker.super_DObject.Class = pPVar6;
        }
        bVar7 = pPVar6 != (PClass *)0x0;
        if (pPVar6 != pPVar4 && bVar7) {
          do {
            pPVar6 = pPVar6->ParentClass;
            bVar7 = pPVar6 != (PClass *)0x0;
            if (pPVar6 == pPVar4) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        if (!bVar7) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005fec47;
        }
      }
      pPVar4 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005feb8b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005fec37;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar6;
            }
            bVar7 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar4 && bVar7) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar7 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar4) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar7) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005fec47;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005fec37;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005feb8b:
        local_2c.ID = S_FindSound("human/imonfire");
        S_Sound(&ent->super_AActor,2,&local_2c,1.0,1.0);
        ppVar3 = (ent->super_AActor).player;
        if ((ppVar3 != (player_t *)0x0) && (ppVar3->mo == ent)) {
          local_30.Index = FName::NameManager::FindName(&FName::NameData,"FireHands",false);
          state = AActor::FindState(&ent->super_AActor,&local_30);
          P_SetPsprite(ppVar3,PSP_STRIFEHANDS,state,false);
          ppVar3 = (ent->super_AActor).player;
          ppVar3->ReadyWeapon = (AWeapon *)0x0;
          ppVar3->PendingWeapon = (AWeapon *)0xffffffffffffffff;
          ppVar3->playerstate = '\0';
          ppVar3->extralight = 3;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005fec47;
    }
    if (ent == (APlayerPawn *)0x0) goto LAB_005feacb;
  }
LAB_005fec37:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005fec47:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifestuff.cpp"
                ,0x15d,"int AF_A_ItBurnsItBurns(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ItBurnsItBurns)
{
	PARAM_ACTION_PROLOGUE;

	S_Sound (self, CHAN_VOICE, "human/imonfire", 1, ATTN_NORM);

	if (self->player != nullptr && self->player->mo == self)
	{
		P_SetPsprite(self->player, PSP_STRIFEHANDS, self->FindState("FireHands"));

		self->player->ReadyWeapon = nullptr;
		self->player->PendingWeapon = WP_NOCHANGE;
		self->player->playerstate = PST_LIVE;
		self->player->extralight = 3;
	}
	return 0;
}